

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derTOCTDec2(octet *val,octet *der,size_t count,u32 tag,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  u32 t;
  size_t l;
  u32 local_34;
  size_t local_30;
  
  sVar1 = derTLDec(&local_34,&local_30,der,count);
  if (sVar1 == 0xffffffffffffffff) {
    sVar2 = 0xffffffffffffffff;
  }
  else {
    der = der + sVar1;
    sVar2 = 0xffffffffffffffff;
    if (local_30 + sVar1 <= count) {
      sVar2 = local_30 + sVar1;
    }
  }
  bVar3 = sVar2 == 0xffffffffffffffff;
  if ((local_30 != len || local_34 != tag) || bVar3) {
    sVar2 = 0xffffffffffffffff;
  }
  sVar1 = 0xffffffffffffffff;
  if (((local_30 == len && local_34 == tag) && !bVar3) && (sVar1 = sVar2, val != (octet *)0x0)) {
    memMove(val,der,len);
  }
  return sVar1;
}

Assistant:

size_t derTOCTDec2(octet* val, const octet der[], size_t count, u32 tag,
	size_t len)
{
	const octet* v;
	count = derDec3(&v, der, count, tag, len);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	if (val)
		memMove(val, v, len);
	return count;
}